

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

uint TA_MACDEXT_FramePPLB(TA_ParamHolderPriv *params)

{
  TA_ParamHolderOptInput *pTVar1;
  uint uVar2;
  
  pTVar1 = params->optIn;
  uVar2 = TA_MACDEXT_Lookback((pTVar1->data).optInInteger,pTVar1[1].data.optInInteger,
                              pTVar1[2].data.optInInteger,pTVar1[3].data.optInInteger,
                              pTVar1[4].data.optInInteger,pTVar1[5].data.optInInteger);
  return uVar2;
}

Assistant:

unsigned int TA_MACDEXT_FramePPLB( const TA_ParamHolderPriv *params )
/* Generated */ {
/* Generated */    return TA_MACDEXT_Lookback(params->optIn[0].data.optInInteger, /* optInFastPeriod*/
/* Generated */                         (TA_MAType)params->optIn[1].data.optInInteger, /* optInFastMAType*/
/* Generated */                         params->optIn[2].data.optInInteger, /* optInSlowPeriod*/
/* Generated */                         (TA_MAType)params->optIn[3].data.optInInteger, /* optInSlowMAType*/
/* Generated */                         params->optIn[4].data.optInInteger, /* optInSignalPeriod*/
/* Generated */                         (TA_MAType)params->optIn[5].data.optInInteger /* optInSignalMAType*/ );
/* Generated */ }